

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDenseNetwork.cpp
# Opt level: O0

IDenseNetwork * __thiscall IDenseNetwork::ResetStats(IDenseNetwork *this)

{
  bool bVar1;
  reference ppIVar2;
  ILayer *layer;
  iterator __end1;
  iterator __begin1;
  vector<ILayer_*,_std::allocator<ILayer_*>_> *__range1;
  IDenseNetwork *this_local;
  
  __end1 = std::vector<ILayer_*,_std::allocator<ILayer_*>_>::begin(&this->layers);
  layer = (ILayer *)std::vector<ILayer_*,_std::allocator<ILayer_*>_>::end(&this->layers);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<ILayer_**,_std::vector<ILayer_*,_std::allocator<ILayer_*>_>_>
                                *)&layer);
    if (!bVar1) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<ILayer_**,_std::vector<ILayer_*,_std::allocator<ILayer_*>_>_>::
              operator*(&__end1);
    (*(*ppIVar2)->_vptr_ILayer[5])();
    __gnu_cxx::__normal_iterator<ILayer_**,_std::vector<ILayer_*,_std::allocator<ILayer_*>_>_>::
    operator++(&__end1);
  }
  return this;
}

Assistant:

IDenseNetwork &IDenseNetwork::ResetStats()
{
    for ( auto layer: layers ) {
        layer->ResetStats();
    }
    return *this;
}